

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecognitionException.hpp
# Opt level: O0

string * __thiscall antlr::RecognitionException::getFilename_abi_cxx11_(RecognitionException *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0x28));
  return in_RDI;
}

Assistant:

string getFilename() const throw()
		{
			return fileName;
		}